

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  ushort uVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  RayHitK<4> *pRVar28;
  byte bVar29;
  ulong *puVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  byte bVar48;
  float fVar49;
  float fVar104;
  float fVar105;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar106;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  vint4 ai;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar128;
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  vint4 ai_6;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  vint4 bi_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 bi_7;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar157;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  vint4 bi_3;
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar174 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a1;
  ulong local_13a0;
  size_t local_1398;
  uint local_1390;
  uint local_138c;
  uint local_1388;
  uint local_1384;
  long local_1380;
  ulong local_1378;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  long local_1308;
  long local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  ulong local_12e0;
  ulong local_12d8;
  RayHitK<4> *local_12d0;
  ulong *local_12c8;
  long local_12c0;
  long local_12b8;
  Scene *local_12b0;
  ulong local_12a8;
  RTCFilterFunctionNArguments local_12a0;
  undefined1 local_1270 [8];
  float fStack_1268;
  float fStack_1264;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float local_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220 [16];
  float local_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  byte local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  ulong uVar35;
  undefined1 auVar52 [16];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  
  puVar30 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1350._4_4_ = uVar2;
  local_1350._0_4_ = uVar2;
  local_1350._8_4_ = uVar2;
  local_1350._12_4_ = uVar2;
  auVar146 = ZEXT1664(local_1350);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1370._4_4_ = uVar2;
  local_1370._0_4_ = uVar2;
  local_1370._8_4_ = uVar2;
  local_1370._12_4_ = uVar2;
  auVar142 = ZEXT1664(local_1370);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_11e0._4_4_ = uVar2;
  local_11e0._0_4_ = uVar2;
  local_11e0._8_4_ = uVar2;
  local_11e0._12_4_ = uVar2;
  auVar161 = ZEXT1664(local_11e0);
  fVar129 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar128 = fVar129 * 0.99999964;
  fVar105 = fVar49 * 0.99999964;
  fVar106 = fVar104 * 0.99999964;
  local_1270._4_4_ = fVar106;
  local_1270._0_4_ = fVar106;
  fStack_1268 = fVar106;
  fStack_1264 = fVar106;
  auVar151 = ZEXT1664(_local_1270);
  fVar129 = fVar129 * 1.0000004;
  fVar49 = fVar49 * 1.0000004;
  fVar104 = fVar104 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar45 = uVar41 ^ 0x10;
  uVar46 = uVar43 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1220._4_4_ = iVar3;
  local_1220._0_4_ = iVar3;
  local_1220._8_4_ = iVar3;
  local_1220._12_4_ = iVar3;
  auVar172 = ZEXT1664(local_1220);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar173 = ZEXT1664(auVar50);
  uVar40 = uVar36 ^ 0x10;
  local_11c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar50 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
  auVar174 = ZEXT1664(auVar50);
  fVar106 = fVar128;
  fVar107 = fVar128;
  fVar108 = fVar128;
  fVar109 = fVar105;
  fVar156 = fVar105;
  fVar157 = fVar105;
  fVar163 = fVar129;
  fVar164 = fVar129;
  fVar165 = fVar129;
  fVar166 = fVar49;
  fVar167 = fVar49;
  fVar168 = fVar49;
  fVar169 = fVar104;
  fVar170 = fVar104;
  fVar171 = fVar104;
  local_13a0 = uVar40;
  local_1398 = k;
  local_12f8 = uVar46;
  local_12f0 = uVar45;
  local_12e8 = uVar36;
  local_12e0 = uVar43;
  local_12d8 = uVar41;
  local_12d0 = ray;
  local_1260 = fVar105;
  fStack_125c = fVar105;
  fStack_1258 = fVar105;
  fStack_1254 = fVar105;
  local_1250 = fVar128;
  fStack_124c = fVar128;
  fStack_1248 = fVar128;
  fStack_1244 = fVar128;
  local_1210 = fVar104;
  fStack_120c = fVar104;
  fStack_1208 = fVar104;
  fStack_1204 = fVar104;
  local_1200 = fVar49;
  fStack_11fc = fVar49;
  fStack_11f8 = fVar49;
  fStack_11f4 = fVar49;
  local_11f0 = fVar129;
  fStack_11ec = fVar129;
  fStack_11e8 = fVar129;
  fStack_11e4 = fVar129;
  do {
    local_11d0 = auVar173._0_16_;
    while (pfVar1 = (float *)(puVar30 + -1), puVar30 = puVar30 + -2,
          *pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar44 = *puVar30;
joined_r0x006f94fb:
      if ((uVar44 & 8) != 0) {
        local_1308 = (ulong)((uint)uVar44 & 0xf) - 8;
        if (local_1308 != 0) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_1300 = 0;
          local_12c8 = puVar30;
          do {
            local_1380 = local_1300 * 0x90;
            fVar128 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar44 + 0x80 + local_1380)) *
                      *(float *)(uVar44 + 0x84 + local_1380);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)(uVar44 + 0x20 + local_1380);
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar44 + 0x24 + local_1380);
            uVar20 = vpcmpub_avx512vl(auVar50,auVar126,2);
            auVar50 = vpmovzxbd_avx(auVar50);
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x44 + local_1380);
            auVar69._4_4_ = uVar2;
            auVar69._0_4_ = uVar2;
            auVar69._8_4_ = uVar2;
            auVar69._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar44 + 0x38 + local_1380);
            auVar73._4_4_ = uVar2;
            auVar73._0_4_ = uVar2;
            auVar73._8_4_ = uVar2;
            auVar73._12_4_ = uVar2;
            auVar70 = vfmadd213ps_fma(auVar50,auVar69,auVar73);
            auVar51._8_8_ = 0;
            auVar51._0_8_ = *(ulong *)(uVar44 + 0x50 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar51);
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x74 + local_1380);
            auVar144._4_4_ = uVar2;
            auVar144._0_4_ = uVar2;
            auVar144._8_4_ = uVar2;
            auVar144._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar44 + 0x68 + local_1380);
            auVar147._4_4_ = uVar2;
            auVar147._0_4_ = uVar2;
            auVar147._8_4_ = uVar2;
            auVar147._12_4_ = uVar2;
            auVar50 = vfmadd213ps_fma(auVar50,auVar144,auVar147);
            auVar112._4_4_ = fVar128;
            auVar112._0_4_ = fVar128;
            auVar112._8_4_ = fVar128;
            auVar112._12_4_ = fVar128;
            auVar50 = vsubps_avx(auVar50,auVar70);
            auVar70 = vfmadd213ps_fma(auVar50,auVar112,auVar70);
            auVar50 = vpmovzxbd_avx(auVar126);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar51 = vfmadd213ps_fma(auVar50,auVar69,auVar73);
            auVar127._8_8_ = 0;
            auVar127._0_8_ = *(ulong *)(uVar44 + 0x54 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar127);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar50 = vfmadd213ps_fma(auVar50,auVar144,auVar147);
            auVar50 = vsubps_avx(auVar50,auVar51);
            auVar51 = vfmadd213ps_fma(auVar50,auVar112,auVar51);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(uVar44 + 0x28 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar132);
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x48 + local_1380);
            auVar71._4_4_ = uVar2;
            auVar71._0_4_ = uVar2;
            auVar71._8_4_ = uVar2;
            auVar71._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar44 + 0x3c + local_1380);
            auVar138._4_4_ = uVar2;
            auVar138._0_4_ = uVar2;
            auVar138._8_4_ = uVar2;
            auVar138._12_4_ = uVar2;
            auVar52 = vfmadd213ps_fma(auVar50,auVar71,auVar138);
            auVar145._8_8_ = 0;
            auVar145._0_8_ = *(ulong *)(uVar44 + 0x58 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar145);
            uVar2 = *(undefined4 *)(uVar44 + 0x78 + local_1380);
            auVar148._4_4_ = uVar2;
            auVar148._0_4_ = uVar2;
            auVar148._8_4_ = uVar2;
            auVar148._12_4_ = uVar2;
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x6c + local_1380);
            auVar152._4_4_ = uVar2;
            auVar152._0_4_ = uVar2;
            auVar152._8_4_ = uVar2;
            auVar152._12_4_ = uVar2;
            auVar50 = vfmadd213ps_fma(auVar50,auVar148,auVar152);
            auVar50 = vsubps_avx(auVar50,auVar52);
            auVar52 = vfmadd213ps_fma(auVar50,auVar112,auVar52);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = *(ulong *)(uVar44 + 0x2c + local_1380);
            auVar50 = vpmovzxbd_avx(auVar66);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar126 = vfmadd213ps_fma(auVar50,auVar71,auVar138);
            auVar154._8_8_ = 0;
            auVar154._0_8_ = *(ulong *)(uVar44 + 0x5c + local_1380);
            auVar50 = vpmovzxbd_avx(auVar154);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar50 = vfmadd213ps_fma(auVar50,auVar148,auVar152);
            auVar50 = vsubps_avx(auVar50,auVar126);
            auVar126 = vfmadd213ps_fma(auVar50,auVar112,auVar126);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = *(ulong *)(uVar44 + 0x30 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar65);
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x4c + local_1380);
            auVar139._4_4_ = uVar2;
            auVar139._0_4_ = uVar2;
            auVar139._8_4_ = uVar2;
            auVar139._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar44 + 0x40 + local_1380);
            auVar149._4_4_ = uVar2;
            auVar149._0_4_ = uVar2;
            auVar149._8_4_ = uVar2;
            auVar149._12_4_ = uVar2;
            auVar127 = vfmadd213ps_fma(auVar50,auVar139,auVar149);
            auVar153._8_8_ = 0;
            auVar153._0_8_ = *(ulong *)(uVar44 + 0x60 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar153);
            auVar50 = vcvtdq2ps_avx(auVar50);
            uVar2 = *(undefined4 *)(uVar44 + 0x7c + local_1380);
            auVar155._4_4_ = uVar2;
            auVar155._0_4_ = uVar2;
            auVar155._8_4_ = uVar2;
            auVar155._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar44 + 0x70 + local_1380);
            auVar158._4_4_ = uVar2;
            auVar158._0_4_ = uVar2;
            auVar158._8_4_ = uVar2;
            auVar158._12_4_ = uVar2;
            auVar50 = vfmadd213ps_fma(auVar50,auVar155,auVar158);
            auVar50 = vsubps_avx(auVar50,auVar127);
            auVar127 = vfmadd213ps_fma(auVar50,auVar112,auVar127);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = *(ulong *)(uVar44 + 0x34 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar67);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar132 = vfmadd213ps_fma(auVar50,auVar139,auVar149);
            auVar140._8_8_ = 0;
            auVar140._0_8_ = *(ulong *)(uVar44 + 100 + local_1380);
            auVar50 = vpmovzxbd_avx(auVar140);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar50 = vfmadd213ps_fma(auVar50,auVar155,auVar158);
            auVar50 = vsubps_avx(auVar50,auVar132);
            auVar132 = vfmadd213ps_fma(auVar50,auVar112,auVar132);
            auVar50 = vsubps_avx(auVar70,local_1350);
            auVar113._0_4_ = auVar50._0_4_ * local_1250;
            auVar113._4_4_ = auVar50._4_4_ * fStack_124c;
            auVar113._8_4_ = auVar50._8_4_ * fStack_1248;
            auVar113._12_4_ = auVar50._12_4_ * fStack_1244;
            auVar50 = vsubps_avx(auVar52,local_1370);
            auVar52._0_4_ = auVar50._0_4_ * local_1260;
            auVar52._4_4_ = auVar50._4_4_ * fStack_125c;
            auVar52._8_4_ = auVar50._8_4_ * fStack_1258;
            auVar52._12_4_ = auVar50._12_4_ * fStack_1254;
            auVar50 = vsubps_avx(auVar127,auVar161._0_16_);
            auVar68._0_4_ = auVar50._0_4_ * (float)local_1270._0_4_;
            auVar68._4_4_ = auVar50._4_4_ * (float)local_1270._4_4_;
            auVar68._8_4_ = auVar50._8_4_ * fStack_1268;
            auVar68._12_4_ = auVar50._12_4_ * fStack_1264;
            auVar50 = vsubps_avx(auVar51,local_1350);
            auVar74._0_4_ = fVar129 * auVar50._0_4_;
            auVar74._4_4_ = fVar163 * auVar50._4_4_;
            auVar74._8_4_ = fVar164 * auVar50._8_4_;
            auVar74._12_4_ = fVar165 * auVar50._12_4_;
            auVar50 = vsubps_avx(auVar126,local_1370);
            auVar72._0_4_ = fVar49 * auVar50._0_4_;
            auVar72._4_4_ = fVar166 * auVar50._4_4_;
            auVar72._8_4_ = fVar167 * auVar50._8_4_;
            auVar72._12_4_ = fVar168 * auVar50._12_4_;
            auVar50 = vsubps_avx(auVar132,auVar161._0_16_);
            auVar141._0_4_ = fVar104 * auVar50._0_4_;
            auVar141._4_4_ = fVar169 * auVar50._4_4_;
            auVar141._8_4_ = fVar170 * auVar50._8_4_;
            auVar141._12_4_ = fVar171 * auVar50._12_4_;
            auVar70 = vpminsd_avx(auVar113,auVar74);
            auVar50 = vpmaxsd_avx(auVar113,auVar74);
            auVar51 = vpminsd_avx(auVar52,auVar72);
            auVar70 = vpmaxsd_avx(auVar70,auVar51);
            auVar51 = vpmaxsd_avx(auVar52,auVar72);
            auVar52 = vpminsd_avx(auVar50,auVar51);
            auVar51 = vpminsd_avx(auVar68,auVar141);
            auVar50 = vpmaxsd_avx(auVar68,auVar141);
            auVar51 = vpmaxsd_avx(auVar51,auVar172._0_16_);
            local_11b0 = vpmaxsd_avx(auVar70,auVar51);
            auVar50 = vpminsd_avx512vl(auVar50,auVar173._0_16_);
            auVar50 = vpminsd_avx(auVar52,auVar50);
            local_12a8 = vpcmpd_avx512vl(local_11b0,auVar50,2);
            local_12a8 = ((byte)uVar20 & 0xf) & local_12a8;
            if ((char)local_12a8 != '\0') {
              local_1380 = local_1380 + uVar44;
              do {
                pRVar28 = local_12d0;
                lVar24 = 0;
                for (uVar33 = local_12a8; (uVar33 & 1) == 0;
                    uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  lVar24 = lVar24 + 1;
                }
                fVar128 = *(float *)(ray + k * 4 + 0x80);
                if (*(float *)(local_11b0 + lVar24 * 4) <= fVar128) {
                  uVar6 = *(ushort *)(local_1380 + lVar24 * 8);
                  local_1388 = (uint)uVar6;
                  uVar7 = *(ushort *)(local_1380 + 2 + lVar24 * 8);
                  local_1384 = (uint)uVar7;
                  uVar34 = *(uint *)(local_1380 + 0x88);
                  uVar32 = *(uint *)(local_1380 + 4 + lVar24 * 8);
                  local_1378 = (ulong)uVar32;
                  local_12b0 = context->scene;
                  pGVar8 = (local_12b0->geometries).items[uVar34].ptr;
                  local_12b8 = *(long *)&pGVar8->field_0x58;
                  fVar129 = (pGVar8->time_range).lower;
                  auVar70._4_4_ = fVar129;
                  auVar70._0_4_ = fVar129;
                  auVar70._8_4_ = fVar129;
                  auVar70._12_4_ = fVar129;
                  fVar49 = pGVar8->fnumTimeSegments;
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar70);
                  fVar129 = (pGVar8->time_range).upper - fVar129;
                  auVar121._4_4_ = fVar129;
                  auVar121._0_4_ = fVar129;
                  auVar121._8_4_ = fVar129;
                  auVar121._12_4_ = fVar129;
                  auVar50 = vdivps_avx(auVar50,auVar121);
                  auVar122._0_4_ = fVar49 * auVar50._0_4_;
                  auVar122._4_4_ = fVar49 * auVar50._4_4_;
                  auVar122._8_4_ = fVar49 * auVar50._8_4_;
                  auVar122._12_4_ = fVar49 * auVar50._12_4_;
                  auVar50 = vroundps_avx(auVar122,1);
                  fVar49 = fVar49 + -1.0;
                  auVar133._4_4_ = fVar49;
                  auVar133._0_4_ = fVar49;
                  auVar133._8_4_ = fVar49;
                  auVar133._12_4_ = fVar49;
                  auVar50 = vminps_avx(auVar50,auVar133);
                  auVar132 = auVar174._0_16_;
                  auVar50 = vmaxps_avx512vl(auVar50,auVar132);
                  local_1190 = vsubps_avx(auVar122,auVar50);
                  local_11a0 = vcvtps2dq_avx(auVar50);
                  local_12c0 = pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_1378;
                  local_138c = local_1388 & 0x7fff;
                  local_1390 = local_1384 & 0x7fff;
                  uVar31 = *(uint *)(local_12b8 + 4 + local_12c0);
                  uVar36 = (ulong)uVar31;
                  uVar41 = (ulong)(uVar31 * local_1390 +
                                  *(int *)(local_12b8 + local_12c0) + local_138c);
                  lVar9 = *(long *)&pGVar8[2].numPrimitives;
                  lVar42 = (long)*(int *)(local_11a0 + k * 4) * 0x38;
                  lVar10 = *(long *)(lVar9 + 0x10 + lVar42);
                  lVar11 = *(long *)(lVar9 + lVar42);
                  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar41);
                  lVar12 = *(long *)(lVar9 + 0x48 + lVar42);
                  auVar70 = *(undefined1 (*) [16])(lVar11 + (uVar41 + 1) * lVar10);
                  lVar24 = uVar41 + uVar36;
                  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar24 * lVar10);
                  lVar37 = uVar41 + uVar36 + 1;
                  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar37 * lVar10);
                  uVar40 = (ulong)(-1 < (short)uVar6);
                  lVar38 = uVar41 + uVar40 + 1;
                  auVar126 = *(undefined1 (*) [16])(lVar11 + lVar38 * lVar10);
                  lVar47 = uVar40 + lVar37;
                  auVar127 = *(undefined1 (*) [16])(lVar11 + lVar47 * lVar10);
                  uVar40 = 0;
                  if (-1 < (short)uVar7) {
                    uVar40 = uVar36;
                  }
                  auVar112 = *(undefined1 (*) [16])(lVar11 + (lVar24 + uVar40) * lVar10);
                  auVar113 = *(undefined1 (*) [16])(lVar11 + (lVar37 + uVar40) * lVar10);
                  auVar74 = *(undefined1 (*) [16])(lVar11 + lVar10 * (uVar40 + lVar47));
                  lVar9 = *(long *)(lVar9 + 0x38 + lVar42);
                  auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1190 + local_1398 * 4)));
                  auVar66 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * uVar41),auVar50);
                  auVar66 = vfmadd213ps_avx512vl(auVar66,auVar65,auVar50);
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * (uVar41 + 1)),auVar70
                                      );
                  auVar67 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar70);
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * lVar24),auVar51);
                  auVar68 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar51);
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * lVar37),auVar52);
                  auVar69 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar52);
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * lVar38),auVar126);
                  auVar70 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar126);
                  auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar9 + lVar12 * lVar47),auVar127);
                  auVar71 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar127);
                  auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar9 + lVar12 * (lVar24 + uVar40)),auVar112);
                  auVar72 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar112);
                  auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar9 + lVar12 * (lVar37 + uVar40)),auVar113);
                  auVar73 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar113);
                  auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar9 + (uVar40 + lVar47) * lVar12),auVar74);
                  auVar74 = vfmadd213ps_avx512vl(auVar50,auVar65,auVar74);
                  auVar51 = vunpcklps_avx(auVar67,auVar71);
                  auVar50 = vunpckhps_avx(auVar67,auVar71);
                  auVar52 = vunpcklps_avx(auVar70,auVar69);
                  auVar70 = vunpckhps_avx(auVar70,auVar69);
                  auVar126 = vunpcklps_avx(auVar50,auVar70);
                  auVar127 = vunpcklps_avx(auVar51,auVar52);
                  auVar50 = vunpckhps_avx(auVar51,auVar52);
                  auVar52 = vunpcklps_avx(auVar68,auVar73);
                  auVar70 = vunpckhps_avx(auVar68,auVar73);
                  auVar112 = vunpcklps_avx(auVar69,auVar72);
                  auVar51 = vunpckhps_avx(auVar69,auVar72);
                  auVar51 = vunpcklps_avx(auVar70,auVar51);
                  auVar113 = vunpcklps_avx(auVar52,auVar112);
                  auVar70 = vunpckhps_avx(auVar52,auVar112);
                  auVar78._16_16_ = auVar73;
                  auVar78._0_16_ = auVar68;
                  auVar77._16_16_ = auVar71;
                  auVar77._0_16_ = auVar67;
                  auVar97 = vunpcklps_avx(auVar77,auVar78);
                  auVar86._16_16_ = auVar69;
                  auVar86._0_16_ = auVar66;
                  auVar79._16_16_ = auVar74;
                  auVar79._0_16_ = auVar69;
                  auVar96 = vunpcklps_avx(auVar86,auVar79);
                  auVar81 = vunpcklps_avx(auVar96,auVar97);
                  auVar96 = vunpckhps_avx(auVar96,auVar97);
                  auVar97 = vunpckhps_avx(auVar77,auVar78);
                  auVar80 = vunpckhps_avx(auVar86,auVar79);
                  auVar80 = vunpcklps_avx(auVar80,auVar97);
                  auVar83._16_16_ = auVar127;
                  auVar83._0_16_ = auVar127;
                  auVar84._16_16_ = auVar50;
                  auVar84._0_16_ = auVar50;
                  auVar85._16_16_ = auVar126;
                  auVar85._0_16_ = auVar126;
                  auVar87._16_16_ = auVar113;
                  auVar87._0_16_ = auVar113;
                  auVar88._16_16_ = auVar70;
                  auVar88._0_16_ = auVar70;
                  uVar2 = *(undefined4 *)(local_12d0 + local_1398 * 4);
                  auVar89._4_4_ = uVar2;
                  auVar89._0_4_ = uVar2;
                  auVar89._8_4_ = uVar2;
                  auVar89._12_4_ = uVar2;
                  auVar89._16_4_ = uVar2;
                  auVar89._20_4_ = uVar2;
                  auVar89._24_4_ = uVar2;
                  auVar89._28_4_ = uVar2;
                  auVar75 = vbroadcastss_avx512vl
                                      (ZEXT416(*(uint *)(local_12d0 + local_1398 * 4 + 0x10)));
                  auVar76 = vbroadcastss_avx512vl
                                      (ZEXT416(*(uint *)(local_12d0 + local_1398 * 4 + 0x20)));
                  uVar2 = *(undefined4 *)(local_12d0 + local_1398 * 4 + 0x40);
                  auVar150._4_4_ = uVar2;
                  auVar150._0_4_ = uVar2;
                  auVar150._8_4_ = uVar2;
                  auVar150._12_4_ = uVar2;
                  auVar150._16_4_ = uVar2;
                  auVar150._20_4_ = uVar2;
                  auVar150._24_4_ = uVar2;
                  auVar150._28_4_ = uVar2;
                  auVar77 = vinsertf32x4_avx512vl(ZEXT1632(auVar51),auVar51,1);
                  uVar2 = *(undefined4 *)(local_12d0 + local_1398 * 4 + 0x50);
                  auVar159._4_4_ = uVar2;
                  auVar159._0_4_ = uVar2;
                  auVar159._8_4_ = uVar2;
                  auVar159._12_4_ = uVar2;
                  auVar159._16_4_ = uVar2;
                  auVar159._20_4_ = uVar2;
                  auVar159._24_4_ = uVar2;
                  auVar159._28_4_ = uVar2;
                  fVar129 = *(float *)(local_12d0 + local_1398 * 4 + 0x60);
                  auVar162._4_4_ = fVar129;
                  auVar162._0_4_ = fVar129;
                  auVar162._8_4_ = fVar129;
                  auVar162._12_4_ = fVar129;
                  auVar162._16_4_ = fVar129;
                  auVar162._20_4_ = fVar129;
                  auVar162._24_4_ = fVar129;
                  auVar162._28_4_ = fVar129;
                  auVar97 = vsubps_avx(auVar81,auVar89);
                  auVar78 = vsubps_avx512vl(auVar96,auVar75);
                  auVar79 = vsubps_avx512vl(auVar80,auVar76);
                  auVar96 = vsubps_avx(auVar83,auVar89);
                  auVar80 = vsubps_avx512vl(auVar84,auVar75);
                  auVar81 = vsubps_avx512vl(auVar85,auVar76);
                  auVar82 = vsubps_avx512vl(auVar87,auVar89);
                  auVar83 = vsubps_avx512vl(auVar88,auVar75);
                  auVar76 = vsubps_avx512vl(auVar77,auVar76);
                  auVar77 = vsubps_avx512vl(auVar82,auVar97);
                  auVar84 = vsubps_avx512vl(auVar83,auVar78);
                  auVar85 = vsubps_avx512vl(auVar76,auVar79);
                  auVar86 = vsubps_avx512vl(auVar97,auVar96);
                  auVar87 = vsubps_avx512vl(auVar78,auVar80);
                  auVar88 = vsubps_avx512vl(auVar79,auVar81);
                  auVar89 = vsubps_avx512vl(auVar96,auVar82);
                  auVar90 = vsubps_avx512vl(auVar80,auVar83);
                  auVar91 = vsubps_avx512vl(auVar81,auVar76);
                  auVar75 = vaddps_avx512vl(auVar82,auVar97);
                  auVar92 = vaddps_avx512vl(auVar83,auVar78);
                  auVar93 = vaddps_avx512vl(auVar76,auVar79);
                  auVar94 = vmulps_avx512vl(auVar92,auVar85);
                  auVar94 = vfmsub231ps_avx512vl(auVar94,auVar84,auVar93);
                  auVar93 = vmulps_avx512vl(auVar93,auVar77);
                  auVar93 = vfmsub231ps_avx512vl(auVar93,auVar85,auVar75);
                  auVar75 = vmulps_avx512vl(auVar75,auVar84);
                  auVar50 = vfmsub231ps_fma(auVar75,auVar77,auVar92);
                  auVar92._0_4_ = auVar50._0_4_ * fVar129;
                  auVar92._4_4_ = auVar50._4_4_ * fVar129;
                  auVar92._8_4_ = auVar50._8_4_ * fVar129;
                  auVar92._12_4_ = auVar50._12_4_ * fVar129;
                  auVar92._16_4_ = fVar129 * 0.0;
                  auVar92._20_4_ = fVar129 * 0.0;
                  auVar92._24_4_ = fVar129 * 0.0;
                  auVar92._28_4_ = 0;
                  auVar75 = vfmadd231ps_avx512vl(auVar92,auVar159,auVar93);
                  auVar92 = vfmadd231ps_avx512vl(auVar75,auVar150,auVar94);
                  auVar95._0_4_ = auVar97._0_4_ + auVar96._0_4_;
                  auVar95._4_4_ = auVar97._4_4_ + auVar96._4_4_;
                  auVar95._8_4_ = auVar97._8_4_ + auVar96._8_4_;
                  auVar95._12_4_ = auVar97._12_4_ + auVar96._12_4_;
                  auVar95._16_4_ = auVar97._16_4_ + auVar96._16_4_;
                  auVar95._20_4_ = auVar97._20_4_ + auVar96._20_4_;
                  auVar95._24_4_ = auVar97._24_4_ + auVar96._24_4_;
                  auVar95._28_4_ = auVar97._28_4_ + auVar96._28_4_;
                  auVar75 = vaddps_avx512vl(auVar78,auVar80);
                  auVar93 = vaddps_avx512vl(auVar79,auVar81);
                  auVar94 = vmulps_avx512vl(auVar75,auVar88);
                  auVar94 = vfmsub231ps_avx512vl(auVar94,auVar87,auVar93);
                  auVar93 = vmulps_avx512vl(auVar93,auVar86);
                  auVar93 = vfmsub231ps_avx512vl(auVar93,auVar88,auVar95);
                  auVar95 = vmulps_avx512vl(auVar95,auVar87);
                  auVar95 = vfmsub231ps_avx512vl(auVar95,auVar86,auVar75);
                  auVar75._4_4_ = auVar95._4_4_ * fVar129;
                  auVar75._0_4_ = auVar95._0_4_ * fVar129;
                  auVar75._8_4_ = auVar95._8_4_ * fVar129;
                  auVar75._12_4_ = auVar95._12_4_ * fVar129;
                  auVar75._16_4_ = auVar95._16_4_ * fVar129;
                  auVar75._20_4_ = auVar95._20_4_ * fVar129;
                  auVar75._24_4_ = auVar95._24_4_ * fVar129;
                  auVar75._28_4_ = auVar95._28_4_;
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar159,auVar93);
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar150,auVar94);
                  auVar96 = vaddps_avx512vl(auVar96,auVar82);
                  auVar80 = vaddps_avx512vl(auVar80,auVar83);
                  auVar81 = vaddps_avx512vl(auVar81,auVar76);
                  auVar76 = vmulps_avx512vl(auVar80,auVar91);
                  auVar82 = vfmsub231ps_avx512vl(auVar76,auVar90,auVar81);
                  auVar81 = vmulps_avx512vl(auVar81,auVar89);
                  auVar81 = vfmsub231ps_avx512vl(auVar81,auVar91,auVar96);
                  auVar76._4_4_ = auVar96._4_4_ * auVar90._4_4_;
                  auVar76._0_4_ = auVar96._0_4_ * auVar90._0_4_;
                  auVar76._8_4_ = auVar96._8_4_ * auVar90._8_4_;
                  auVar76._12_4_ = auVar96._12_4_ * auVar90._12_4_;
                  auVar76._16_4_ = auVar96._16_4_ * auVar90._16_4_;
                  auVar76._20_4_ = auVar96._20_4_ * auVar90._20_4_;
                  auVar76._24_4_ = auVar96._24_4_ * auVar90._24_4_;
                  auVar76._28_4_ = auVar96._28_4_;
                  auVar50 = vfmsub231ps_fma(auVar76,auVar89,auVar80);
                  auVar96 = vmulps_avx512vl(ZEXT1632(auVar50),auVar162);
                  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar159,auVar81);
                  auVar76 = vfmadd231ps_avx512vl(auVar96,auVar150,auVar82);
                  auVar82._0_4_ = auVar92._0_4_ + auVar75._0_4_;
                  auVar82._4_4_ = auVar92._4_4_ + auVar75._4_4_;
                  auVar82._8_4_ = auVar92._8_4_ + auVar75._8_4_;
                  auVar82._12_4_ = auVar92._12_4_ + auVar75._12_4_;
                  auVar82._16_4_ = auVar92._16_4_ + auVar75._16_4_;
                  auVar82._20_4_ = auVar92._20_4_ + auVar75._20_4_;
                  auVar82._24_4_ = auVar92._24_4_ + auVar75._24_4_;
                  auVar82._28_4_ = auVar92._28_4_ + auVar75._28_4_;
                  local_1140 = vaddps_avx512vl(auVar76,auVar82);
                  auVar96._8_4_ = 0x7fffffff;
                  auVar96._0_8_ = 0x7fffffff7fffffff;
                  auVar96._12_4_ = 0x7fffffff;
                  auVar96._16_4_ = 0x7fffffff;
                  auVar96._20_4_ = 0x7fffffff;
                  auVar96._24_4_ = 0x7fffffff;
                  auVar96._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_1140,auVar96);
                  auVar80._8_4_ = 0x34000000;
                  auVar80._0_8_ = 0x3400000034000000;
                  auVar80._12_4_ = 0x34000000;
                  auVar80._16_4_ = 0x34000000;
                  auVar80._20_4_ = 0x34000000;
                  auVar80._24_4_ = 0x34000000;
                  auVar80._28_4_ = 0x34000000;
                  auVar96 = vmulps_avx512vl(local_1140,auVar80);
                  auVar80 = vminps_avx512vl(auVar92,auVar75);
                  auVar80 = vminps_avx512vl(auVar80,auVar76);
                  auVar81._8_4_ = 0x80000000;
                  auVar81._0_8_ = 0x8000000080000000;
                  auVar81._12_4_ = 0x80000000;
                  auVar81._16_4_ = 0x80000000;
                  auVar81._20_4_ = 0x80000000;
                  auVar81._24_4_ = 0x80000000;
                  auVar81._28_4_ = 0x80000000;
                  auVar81 = vxorps_avx512vl(auVar96,auVar81);
                  uVar20 = vcmpps_avx512vl(auVar80,auVar81,5);
                  auVar80 = vmaxps_avx512vl(auVar92,auVar75);
                  auVar80 = vmaxps_avx512vl(auVar80,auVar76);
                  uVar22 = vcmpps_avx512vl(auVar80,auVar96,2);
                  bVar48 = (byte)uVar20 | (byte)uVar22;
                  k = local_1398;
                  if (bVar48 != 0) {
                    auVar96 = vmulps_avx512vl(auVar87,auVar85);
                    auVar80 = vmulps_avx512vl(auVar77,auVar88);
                    auVar81 = vmulps_avx512vl(auVar86,auVar84);
                    auVar76 = vmulps_avx512vl(auVar90,auVar88);
                    auVar82 = vmulps_avx512vl(auVar86,auVar91);
                    auVar83 = vmulps_avx512vl(auVar89,auVar87);
                    auVar84 = vfmsub213ps_avx512vl(auVar84,auVar88,auVar96);
                    auVar85 = vfmsub213ps_avx512vl(auVar85,auVar86,auVar80);
                    auVar77 = vfmsub213ps_avx512vl(auVar77,auVar87,auVar81);
                    auVar87 = vfmsub213ps_avx512vl(auVar91,auVar87,auVar76);
                    auVar88 = vfmsub213ps_avx512vl(auVar89,auVar88,auVar82);
                    auVar86 = vfmsub213ps_avx512vl(auVar90,auVar86,auVar83);
                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar96,auVar89);
                    vandps_avx512vl(auVar76,auVar89);
                    uVar40 = vcmpps_avx512vl(auVar89,auVar89,1);
                    vandps_avx512vl(auVar80,auVar89);
                    vandps_avx512vl(auVar82,auVar89);
                    uVar36 = vcmpps_avx512vl(auVar89,auVar89,1);
                    vandps_avx512vl(auVar81,auVar89);
                    vandps_avx512vl(auVar83,auVar89);
                    uVar41 = vcmpps_avx512vl(auVar89,auVar89,1);
                    bVar19 = (bool)((byte)uVar40 & 1);
                    auVar93._0_4_ =
                         (float)((uint)bVar19 * auVar84._0_4_ | (uint)!bVar19 * auVar87._0_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 1) & 1);
                    auVar93._4_4_ =
                         (float)((uint)bVar19 * auVar84._4_4_ | (uint)!bVar19 * auVar87._4_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 2) & 1);
                    auVar93._8_4_ =
                         (float)((uint)bVar19 * auVar84._8_4_ | (uint)!bVar19 * auVar87._8_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
                    auVar93._12_4_ =
                         (float)((uint)bVar19 * auVar84._12_4_ | (uint)!bVar19 * auVar87._12_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 4) & 1);
                    auVar93._16_4_ =
                         (float)((uint)bVar19 * auVar84._16_4_ | (uint)!bVar19 * auVar87._16_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                    auVar93._20_4_ =
                         (float)((uint)bVar19 * auVar84._20_4_ | (uint)!bVar19 * auVar87._20_4_);
                    bVar19 = (bool)((byte)(uVar40 >> 6) & 1);
                    auVar93._24_4_ =
                         (float)((uint)bVar19 * auVar84._24_4_ | (uint)!bVar19 * auVar87._24_4_);
                    bVar19 = SUB81(uVar40 >> 7,0);
                    auVar93._28_4_ = (uint)bVar19 * auVar84._28_4_ | (uint)!bVar19 * auVar87._28_4_;
                    bVar19 = (bool)((byte)uVar36 & 1);
                    auVar94._0_4_ =
                         (float)((uint)bVar19 * auVar85._0_4_ | (uint)!bVar19 * auVar88._0_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 1) & 1);
                    auVar94._4_4_ =
                         (float)((uint)bVar19 * auVar85._4_4_ | (uint)!bVar19 * auVar88._4_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                    auVar94._8_4_ =
                         (float)((uint)bVar19 * auVar85._8_4_ | (uint)!bVar19 * auVar88._8_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 3) & 1);
                    auVar94._12_4_ =
                         (float)((uint)bVar19 * auVar85._12_4_ | (uint)!bVar19 * auVar88._12_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 4) & 1);
                    auVar94._16_4_ =
                         (float)((uint)bVar19 * auVar85._16_4_ | (uint)!bVar19 * auVar88._16_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 5) & 1);
                    auVar94._20_4_ =
                         (float)((uint)bVar19 * auVar85._20_4_ | (uint)!bVar19 * auVar88._20_4_);
                    bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                    auVar94._24_4_ =
                         (float)((uint)bVar19 * auVar85._24_4_ | (uint)!bVar19 * auVar88._24_4_);
                    bVar19 = SUB81(uVar36 >> 7,0);
                    auVar94._28_4_ = (uint)bVar19 * auVar85._28_4_ | (uint)!bVar19 * auVar88._28_4_;
                    bVar19 = (bool)((byte)uVar41 & 1);
                    fVar49 = (float)((uint)bVar19 * auVar77._0_4_ | (uint)!bVar19 * auVar86._0_4_);
                    bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                    fVar104 = (float)((uint)bVar19 * auVar77._4_4_ | (uint)!bVar19 * auVar86._4_4_);
                    bVar19 = (bool)((byte)(uVar41 >> 2) & 1);
                    fVar105 = (float)((uint)bVar19 * auVar77._8_4_ | (uint)!bVar19 * auVar86._8_4_);
                    bVar19 = (bool)((byte)(uVar41 >> 3) & 1);
                    fVar106 = (float)((uint)bVar19 * auVar77._12_4_ | (uint)!bVar19 * auVar86._12_4_
                                     );
                    bVar19 = (bool)((byte)(uVar41 >> 4) & 1);
                    fVar107 = (float)((uint)bVar19 * auVar77._16_4_ | (uint)!bVar19 * auVar86._16_4_
                                     );
                    bVar19 = (bool)((byte)(uVar41 >> 5) & 1);
                    fVar108 = (float)((uint)bVar19 * auVar77._20_4_ | (uint)!bVar19 * auVar86._20_4_
                                     );
                    bVar19 = (bool)((byte)(uVar41 >> 6) & 1);
                    fVar109 = (float)((uint)bVar19 * auVar77._24_4_ | (uint)!bVar19 * auVar86._24_4_
                                     );
                    bVar19 = SUB81(uVar41 >> 7,0);
                    auVar91._4_4_ = fVar129 * fVar104;
                    auVar91._0_4_ = fVar129 * fVar49;
                    auVar91._8_4_ = fVar129 * fVar105;
                    auVar91._12_4_ = fVar129 * fVar106;
                    auVar91._16_4_ = fVar129 * fVar107;
                    auVar91._20_4_ = fVar129 * fVar108;
                    auVar91._24_4_ = fVar129 * fVar109;
                    auVar91._28_4_ = fVar129;
                    auVar50 = vfmadd213ps_fma(auVar159,auVar94,auVar91);
                    auVar50 = vfmadd213ps_fma(auVar150,auVar93,ZEXT1632(auVar50));
                    auVar80 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar50._12_4_,
                                                 CONCAT48(auVar50._8_4_ + auVar50._8_4_,
                                                          CONCAT44(auVar50._4_4_ + auVar50._4_4_,
                                                                   auVar50._0_4_ + auVar50._0_4_))))
                    ;
                    auVar160._0_4_ = auVar79._0_4_ * fVar49;
                    auVar160._4_4_ = auVar79._4_4_ * fVar104;
                    auVar160._8_4_ = auVar79._8_4_ * fVar105;
                    auVar160._12_4_ = auVar79._12_4_ * fVar106;
                    auVar160._16_4_ = auVar79._16_4_ * fVar107;
                    auVar160._20_4_ = auVar79._20_4_ * fVar108;
                    auVar160._24_4_ = auVar79._24_4_ * fVar109;
                    auVar160._28_4_ = 0;
                    auVar50 = vfmadd213ps_fma(auVar78,auVar94,auVar160);
                    auVar70 = vfmadd213ps_fma(auVar97,auVar93,ZEXT1632(auVar50));
                    auVar96 = vrcp14ps_avx512vl(auVar80);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = 0x3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    auVar97._16_4_ = 0x3f800000;
                    auVar97._20_4_ = 0x3f800000;
                    auVar97._24_4_ = 0x3f800000;
                    auVar97._28_4_ = 0x3f800000;
                    auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar80,auVar97);
                    auVar50 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
                    local_1240._28_4_ = auVar96._28_4_;
                    local_1240._0_28_ =
                         ZEXT1628(CONCAT412(auVar50._12_4_ * (auVar70._12_4_ + auVar70._12_4_),
                                            CONCAT48(auVar50._8_4_ * (auVar70._8_4_ + auVar70._8_4_)
                                                     ,CONCAT44(auVar50._4_4_ *
                                                               (auVar70._4_4_ + auVar70._4_4_),
                                                               auVar50._0_4_ *
                                                               (auVar70._0_4_ + auVar70._0_4_)))));
                    auVar142 = ZEXT3264(local_1240);
                    auVar114._4_4_ = fVar128;
                    auVar114._0_4_ = fVar128;
                    auVar114._8_4_ = fVar128;
                    auVar114._12_4_ = fVar128;
                    auVar114._16_4_ = fVar128;
                    auVar114._20_4_ = fVar128;
                    auVar114._24_4_ = fVar128;
                    auVar114._28_4_ = fVar128;
                    uVar20 = vcmpps_avx512vl(local_1240,auVar114,2);
                    uVar2 = *(undefined4 *)(local_12d0 + local_1398 * 4 + 0x30);
                    auVar90._4_4_ = uVar2;
                    auVar90._0_4_ = uVar2;
                    auVar90._8_4_ = uVar2;
                    auVar90._12_4_ = uVar2;
                    auVar90._16_4_ = uVar2;
                    auVar90._20_4_ = uVar2;
                    auVar90._24_4_ = uVar2;
                    auVar90._28_4_ = uVar2;
                    uVar22 = vcmpps_avx512vl(local_1240,auVar90,0xd);
                    bVar48 = (byte)uVar20 & (byte)uVar22 & bVar48;
                    if (bVar48 != 0) {
                      uVar40 = vcmpps_avx512vl(auVar80,_DAT_01faff00,4);
                      uVar40 = bVar48 & uVar40;
                      local_1118 = (byte)uVar40;
                      if (local_1118 != 0) {
                        local_1120 = &local_13a1;
                        local_10c0 = local_1240;
                        auVar97 = vsubps_avx(local_1140,auVar75);
                        auVar97 = vblendps_avx(auVar92,auVar97,0xf0);
                        auVar96 = vsubps_avx(local_1140,auVar92);
                        local_1160 = vblendps_avx(auVar75,auVar96,0xf0);
                        local_10a0[0] = auVar93._0_4_ * 1.0;
                        local_10a0[1] = auVar93._4_4_ * 1.0;
                        local_10a0[2] = auVar93._8_4_ * 1.0;
                        local_10a0[3] = auVar93._12_4_ * 1.0;
                        fStack_1090 = auVar93._16_4_ * -1.0;
                        fStack_108c = auVar93._20_4_ * -1.0;
                        fStack_1088 = auVar93._24_4_ * -1.0;
                        uStack_1084 = auVar93._28_4_;
                        local_1080[0] = auVar94._0_4_ * 1.0;
                        local_1080[1] = auVar94._4_4_ * 1.0;
                        local_1080[2] = auVar94._8_4_ * 1.0;
                        local_1080[3] = auVar94._12_4_ * 1.0;
                        fStack_1070 = auVar94._16_4_ * -1.0;
                        fStack_106c = auVar94._20_4_ * -1.0;
                        fStack_1068 = auVar94._24_4_ * -1.0;
                        uStack_1064 = auVar94._28_4_;
                        local_1060._4_4_ = fVar104 * 1.0;
                        local_1060._0_4_ = fVar49 * 1.0;
                        local_1060._8_4_ = fVar105 * 1.0;
                        local_1060._12_4_ = fVar106 * 1.0;
                        local_1060._16_4_ = fVar107 * -1.0;
                        local_1060._20_4_ = fVar108 * -1.0;
                        local_1060._24_4_ = fVar109 * -1.0;
                        local_1060._28_4_ =
                             (uint)bVar19 * auVar77._28_4_ | (uint)!bVar19 * auVar86._28_4_;
                        auVar80 = vpbroadcastd_avx512vl();
                        auVar96 = vpaddd_avx2(auVar80,_DAT_01fec4a0);
                        auVar134._0_4_ = (float)(int)(*(ushort *)(local_12b8 + 8 + local_12c0) - 1);
                        auVar134._4_12_ = auVar79._4_12_;
                        auVar99._16_16_ = auVar80._16_16_;
                        auVar99._0_16_ = auVar132;
                        auVar98._4_28_ = auVar99._4_28_;
                        auVar98._0_4_ = auVar134._0_4_;
                        auVar70 = vrcp14ss_avx512f(auVar132,auVar98._0_16_);
                        auVar50 = vfnmadd213ss_fma(auVar70,auVar134,ZEXT416(0x40000000));
                        fVar129 = auVar70._0_4_ * auVar50._0_4_;
                        auVar96 = vcvtdq2ps_avx(auVar96);
                        fVar108 = auVar96._28_4_ + auVar97._28_4_;
                        fVar49 = (local_1140._0_4_ * auVar96._0_4_ + auVar97._0_4_) * fVar129;
                        fVar104 = (local_1140._4_4_ * auVar96._4_4_ + auVar97._4_4_) * fVar129;
                        local_1180._4_4_ = fVar104;
                        local_1180._0_4_ = fVar49;
                        fVar128 = (local_1140._8_4_ * auVar96._8_4_ + auVar97._8_4_) * fVar129;
                        local_1180._8_4_ = fVar128;
                        fVar105 = (local_1140._12_4_ * auVar96._12_4_ + auVar97._12_4_) * fVar129;
                        local_1180._12_4_ = fVar105;
                        fVar106 = (local_1140._16_4_ * auVar96._16_4_ + auVar97._16_4_) * fVar129;
                        local_1180._16_4_ = fVar106;
                        fVar107 = (local_1140._20_4_ * auVar96._20_4_ + auVar97._20_4_) * fVar129;
                        local_1180._20_4_ = fVar107;
                        fVar129 = (local_1140._24_4_ * auVar96._24_4_ + auVar97._24_4_) * fVar129;
                        local_1180._24_4_ = fVar129;
                        local_1180._28_4_ = fVar108;
                        pGVar8 = (local_12b0->geometries).items[uVar34].ptr;
                        if ((pGVar8->mask & *(uint *)(local_12d0 + local_1398 * 4 + 0x90)) != 0) {
                          auVar96 = vpbroadcastd_avx512vl();
                          auVar97 = vpaddd_avx2(auVar96,_DAT_01fec4c0);
                          auVar97 = vcvtdq2ps_avx(auVar97);
                          auVar135._0_4_ =
                               (float)(int)(*(ushort *)(local_12b8 + 10 + local_12c0) - 1);
                          auVar135._4_12_ = auVar92._4_12_;
                          auVar101._16_16_ = auVar96._16_16_;
                          auVar101._0_16_ = auVar132;
                          auVar100._4_28_ = auVar101._4_28_;
                          auVar100._0_4_ = auVar135._0_4_;
                          auVar70 = vrcp14ss_avx512f(auVar132,auVar100._0_16_);
                          auVar50 = vfnmadd213ss_fma(auVar70,auVar135,ZEXT416(0x40000000));
                          fVar167 = auVar70._0_4_ * auVar50._0_4_;
                          auVar25._8_4_ = 0x219392ef;
                          auVar25._0_8_ = 0x219392ef219392ef;
                          auVar25._12_4_ = 0x219392ef;
                          auVar25._16_4_ = 0x219392ef;
                          auVar25._20_4_ = 0x219392ef;
                          auVar25._24_4_ = 0x219392ef;
                          auVar25._28_4_ = 0x219392ef;
                          uVar36 = vcmpps_avx512vl(local_1140,auVar25,5);
                          auVar96 = vrcp14ps_avx512vl(local_1140);
                          auVar137._8_4_ = 0x3f800000;
                          auVar137._0_8_ = 0x3f8000003f800000;
                          auVar137._12_4_ = 0x3f800000;
                          auVar137._16_4_ = 0x3f800000;
                          auVar137._20_4_ = 0x3f800000;
                          auVar137._24_4_ = 0x3f800000;
                          auVar137._28_4_ = 0x3f800000;
                          auVar50 = vfnmadd213ps_fma(local_1140,auVar96,auVar137);
                          auVar96 = vfmadd132ps_avx512vl(ZEXT1632(auVar50),auVar96,auVar96);
                          fVar156 = (float)((uint)((byte)uVar36 & 1) * auVar96._0_4_);
                          fVar109 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar96._4_4_);
                          fVar157 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar96._8_4_);
                          fVar163 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar96._12_4_);
                          fVar164 = (float)((uint)((byte)(uVar36 >> 4) & 1) * auVar96._16_4_);
                          fVar165 = (float)((uint)((byte)(uVar36 >> 5) & 1) * auVar96._20_4_);
                          fVar166 = (float)((uint)((byte)(uVar36 >> 6) & 1) * auVar96._24_4_);
                          auVar26._4_4_ = fVar104 * fVar109;
                          auVar26._0_4_ = fVar49 * fVar156;
                          auVar26._8_4_ = fVar128 * fVar157;
                          auVar26._12_4_ = fVar105 * fVar163;
                          auVar26._16_4_ = fVar106 * fVar164;
                          auVar26._20_4_ = fVar107 * fVar165;
                          auVar26._24_4_ = fVar129 * fVar166;
                          auVar26._28_4_ = fVar108;
                          local_1100 = vminps_avx(auVar26,auVar137);
                          auVar27._4_4_ =
                               (local_1140._4_4_ * auVar97._4_4_ + local_1160._4_4_) * fVar167 *
                               fVar109;
                          auVar27._0_4_ =
                               (local_1140._0_4_ * auVar97._0_4_ + local_1160._0_4_) * fVar167 *
                               fVar156;
                          auVar27._8_4_ =
                               (local_1140._8_4_ * auVar97._8_4_ + local_1160._8_4_) * fVar167 *
                               fVar157;
                          auVar27._12_4_ =
                               (local_1140._12_4_ * auVar97._12_4_ + local_1160._12_4_) * fVar167 *
                               fVar163;
                          auVar27._16_4_ =
                               (local_1140._16_4_ * auVar97._16_4_ + local_1160._16_4_) * fVar167 *
                               fVar164;
                          auVar27._20_4_ =
                               (local_1140._20_4_ * auVar97._20_4_ + local_1160._20_4_) * fVar167 *
                               fVar165;
                          auVar27._24_4_ =
                               (local_1140._24_4_ * auVar97._24_4_ + local_1160._24_4_) * fVar167 *
                               fVar166;
                          auVar27._28_4_ = auVar97._28_4_ + local_1160._28_4_;
                          local_10e0 = vminps_avx(auVar27,auVar137);
                          auVar115._8_4_ = 0x7f800000;
                          auVar115._0_8_ = 0x7f8000007f800000;
                          auVar115._12_4_ = 0x7f800000;
                          auVar115._16_4_ = 0x7f800000;
                          auVar115._20_4_ = 0x7f800000;
                          auVar115._24_4_ = 0x7f800000;
                          auVar115._28_4_ = 0x7f800000;
                          auVar97 = vblendmps_avx512vl(auVar115,local_1240);
                          auVar102._0_4_ =
                               (uint)(local_1118 & 1) * auVar97._0_4_ |
                               (uint)!(bool)(local_1118 & 1) * 0x7f800000;
                          bVar19 = (bool)((byte)(uVar40 >> 1) & 1);
                          auVar102._4_4_ = (uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * 0x7f800000
                          ;
                          bVar19 = (bool)((byte)(uVar40 >> 2) & 1);
                          auVar102._8_4_ = (uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * 0x7f800000
                          ;
                          bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
                          auVar102._12_4_ =
                               (uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * 0x7f800000;
                          bVar19 = (bool)((byte)(uVar40 >> 4) & 1);
                          auVar102._16_4_ =
                               (uint)bVar19 * auVar97._16_4_ | (uint)!bVar19 * 0x7f800000;
                          bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                          auVar102._20_4_ =
                               (uint)bVar19 * auVar97._20_4_ | (uint)!bVar19 * 0x7f800000;
                          bVar19 = (bool)((byte)(uVar40 >> 6) & 1);
                          auVar102._24_4_ =
                               (uint)bVar19 * auVar97._24_4_ | (uint)!bVar19 * 0x7f800000;
                          bVar19 = SUB81(uVar40 >> 7,0);
                          auVar102._28_4_ =
                               (uint)bVar19 * auVar97._28_4_ | (uint)!bVar19 * 0x7f800000;
                          auVar97 = vshufps_avx(auVar102,auVar102,0xb1);
                          auVar97 = vminps_avx(auVar102,auVar97);
                          auVar96 = vshufpd_avx(auVar97,auVar97,5);
                          auVar97 = vminps_avx(auVar97,auVar96);
                          auVar96 = vpermpd_avx2(auVar97,0x4e);
                          auVar97 = vminps_avx(auVar97,auVar96);
                          uVar20 = vcmpps_avx512vl(auVar102,auVar97,0);
                          uVar31 = (uint)uVar40;
                          if ((local_1118 & (byte)uVar20) != 0) {
                            uVar31 = (uint)(local_1118 & (byte)uVar20);
                          }
                          uVar23 = 0;
                          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                            uVar23 = uVar23 + 1;
                          }
                          uVar36 = (ulong)uVar23;
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1330 = vpbroadcastd_avx512vl();
                            local_1340 = vpbroadcastd_avx512vl();
                            local_1360 = ZEXT416(*(uint *)(local_12d0 + local_1398 * 4 + 0x80));
                            do {
                              auVar50 = auVar174._0_16_;
                              uVar2 = *(undefined4 *)(local_1100 + uVar36 * 4);
                              local_1000._4_4_ = uVar2;
                              local_1000._0_4_ = uVar2;
                              local_1000._8_4_ = uVar2;
                              local_1000._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)(local_10e0 + uVar36 * 4);
                              local_ff0._4_4_ = uVar2;
                              local_ff0._0_4_ = uVar2;
                              local_ff0._8_4_ = uVar2;
                              local_ff0._12_4_ = uVar2;
                              *(float *)(pRVar28 + k * 4 + 0x80) = local_10a0[uVar36 - 8];
                              local_12a0.context = context->user;
                              local_1030 = local_10a0[uVar36];
                              fVar129 = local_1080[uVar36];
                              local_1020._4_4_ = fVar129;
                              local_1020._0_4_ = fVar129;
                              local_1020._8_4_ = fVar129;
                              local_1020._12_4_ = fVar129;
                              uVar2 = *(undefined4 *)(local_1060 + uVar36 * 4);
                              local_1010._4_4_ = uVar2;
                              local_1010._0_4_ = uVar2;
                              local_1010._8_4_ = uVar2;
                              local_1010._12_4_ = uVar2;
                              fStack_102c = local_1030;
                              fStack_1028 = local_1030;
                              fStack_1024 = local_1030;
                              local_fe0 = local_1340._0_8_;
                              uStack_fd8 = local_1340._8_8_;
                              local_fd0 = local_1330;
                              vpcmpeqd_avx2(ZEXT1632(local_1330),ZEXT1632(local_1330));
                              uStack_fbc = (local_12a0.context)->instID[0];
                              local_fc0 = uStack_fbc;
                              uStack_fb8 = uStack_fbc;
                              uStack_fb4 = uStack_fbc;
                              uStack_fb0 = (local_12a0.context)->instPrimID[0];
                              uStack_fac = uStack_fb0;
                              uStack_fa8 = uStack_fb0;
                              uStack_fa4 = uStack_fb0;
                              local_1320 = local_11c0;
                              local_12a0.valid = (int *)local_1320;
                              local_12a0.geometryUserPtr = pGVar8->userPtr;
                              local_12a0.ray = (RTCRayN *)pRVar28;
                              local_12a0.hit = (RTCHitN *)&local_1030;
                              local_12a0.N = 4;
                              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->intersectionFilterN)(&local_12a0);
                                auVar142 = ZEXT3264(local_1240);
                                auVar50 = vxorps_avx512vl(auVar50,auVar50);
                                auVar174 = ZEXT1664(auVar50);
                                k = local_1398;
                              }
                              auVar50 = auVar174._0_16_;
                              uVar41 = vptestmd_avx512vl(local_1320,local_1320);
                              if ((uVar41 & 0xf) == 0) {
LAB_006fa719:
                                *(undefined4 *)(pRVar28 + k * 4 + 0x80) = local_1360._0_4_;
                              }
                              else {
                                p_Var13 = context->args->filter;
                                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var13)(&local_12a0);
                                  auVar142 = ZEXT3264(local_1240);
                                  auVar50 = vxorps_avx512vl(auVar50,auVar50);
                                  auVar174 = ZEXT1664(auVar50);
                                  k = local_1398;
                                }
                                uVar41 = vptestmd_avx512vl(local_1320,local_1320);
                                uVar41 = uVar41 & 0xf;
                                bVar48 = (byte)uVar41;
                                if (bVar48 == 0) goto LAB_006fa719;
                                fVar129 = *(float *)(local_12a0.hit + 4);
                                fVar49 = *(float *)(local_12a0.hit + 8);
                                fVar104 = *(float *)(local_12a0.hit + 0xc);
                                bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                                bVar18 = SUB81(uVar41 >> 3,0);
                                *(uint *)(local_12a0.ray + 0xc0) =
                                     (uint)(bVar48 & 1) * (int)*(float *)local_12a0.hit |
                                     (uint)!(bool)(bVar48 & 1) * *(int *)(local_12a0.ray + 0xc0);
                                *(uint *)(local_12a0.ray + 0xc4) =
                                     (uint)bVar19 * (int)fVar129 |
                                     (uint)!bVar19 * *(int *)(local_12a0.ray + 0xc4);
                                *(uint *)(local_12a0.ray + 200) =
                                     (uint)bVar15 * (int)fVar49 |
                                     (uint)!bVar15 * *(int *)(local_12a0.ray + 200);
                                *(uint *)(local_12a0.ray + 0xcc) =
                                     (uint)bVar18 * (int)fVar104 |
                                     (uint)!bVar18 * *(int *)(local_12a0.ray + 0xcc);
                                fVar129 = *(float *)(local_12a0.hit + 0x14);
                                fVar49 = *(float *)(local_12a0.hit + 0x18);
                                fVar104 = *(float *)(local_12a0.hit + 0x1c);
                                bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                                bVar18 = SUB81(uVar41 >> 3,0);
                                *(uint *)(local_12a0.ray + 0xd0) =
                                     (uint)(bVar48 & 1) * (int)*(float *)(local_12a0.hit + 0x10) |
                                     (uint)!(bool)(bVar48 & 1) * *(int *)(local_12a0.ray + 0xd0);
                                *(uint *)(local_12a0.ray + 0xd4) =
                                     (uint)bVar19 * (int)fVar129 |
                                     (uint)!bVar19 * *(int *)(local_12a0.ray + 0xd4);
                                *(uint *)(local_12a0.ray + 0xd8) =
                                     (uint)bVar15 * (int)fVar49 |
                                     (uint)!bVar15 * *(int *)(local_12a0.ray + 0xd8);
                                *(uint *)(local_12a0.ray + 0xdc) =
                                     (uint)bVar18 * (int)fVar104 |
                                     (uint)!bVar18 * *(int *)(local_12a0.ray + 0xdc);
                                fVar129 = *(float *)(local_12a0.hit + 0x24);
                                fVar49 = *(float *)(local_12a0.hit + 0x28);
                                fVar104 = *(float *)(local_12a0.hit + 0x2c);
                                bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                                bVar18 = SUB81(uVar41 >> 3,0);
                                *(uint *)(local_12a0.ray + 0xe0) =
                                     (uint)(bVar48 & 1) * (int)*(float *)(local_12a0.hit + 0x20) |
                                     (uint)!(bool)(bVar48 & 1) * *(int *)(local_12a0.ray + 0xe0);
                                *(uint *)(local_12a0.ray + 0xe4) =
                                     (uint)bVar19 * (int)fVar129 |
                                     (uint)!bVar19 * *(int *)(local_12a0.ray + 0xe4);
                                *(uint *)(local_12a0.ray + 0xe8) =
                                     (uint)bVar15 * (int)fVar49 |
                                     (uint)!bVar15 * *(int *)(local_12a0.ray + 0xe8);
                                *(uint *)(local_12a0.ray + 0xec) =
                                     (uint)bVar18 * (int)fVar104 |
                                     (uint)!bVar18 * *(int *)(local_12a0.ray + 0xec);
                                fVar129 = *(float *)(local_12a0.hit + 0x34);
                                fVar49 = *(float *)(local_12a0.hit + 0x38);
                                fVar104 = *(float *)(local_12a0.hit + 0x3c);
                                bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                                bVar18 = SUB81(uVar41 >> 3,0);
                                *(uint *)(local_12a0.ray + 0xf0) =
                                     (uint)(bVar48 & 1) * (int)*(float *)(local_12a0.hit + 0x30) |
                                     (uint)!(bool)(bVar48 & 1) * *(int *)(local_12a0.ray + 0xf0);
                                *(uint *)(local_12a0.ray + 0xf4) =
                                     (uint)bVar19 * (int)fVar129 |
                                     (uint)!bVar19 * *(int *)(local_12a0.ray + 0xf4);
                                *(uint *)(local_12a0.ray + 0xf8) =
                                     (uint)bVar15 * (int)fVar49 |
                                     (uint)!bVar15 * *(int *)(local_12a0.ray + 0xf8);
                                *(uint *)(local_12a0.ray + 0xfc) =
                                     (uint)bVar18 * (int)fVar104 |
                                     (uint)!bVar18 * *(int *)(local_12a0.ray + 0xfc);
                                fVar129 = *(float *)(local_12a0.hit + 0x44);
                                fVar49 = *(float *)(local_12a0.hit + 0x48);
                                fVar104 = *(float *)(local_12a0.hit + 0x4c);
                                bVar19 = (bool)((byte)(uVar41 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                                bVar18 = SUB81(uVar41 >> 3,0);
                                *(uint *)(local_12a0.ray + 0x100) =
                                     (uint)(bVar48 & 1) * (int)*(float *)(local_12a0.hit + 0x40) |
                                     (uint)!(bool)(bVar48 & 1) * *(int *)(local_12a0.ray + 0x100);
                                *(uint *)(local_12a0.ray + 0x104) =
                                     (uint)bVar19 * (int)fVar129 |
                                     (uint)!bVar19 * *(int *)(local_12a0.ray + 0x104);
                                *(uint *)(local_12a0.ray + 0x108) =
                                     (uint)bVar15 * (int)fVar49 |
                                     (uint)!bVar15 * *(int *)(local_12a0.ray + 0x108);
                                *(uint *)(local_12a0.ray + 0x10c) =
                                     (uint)bVar18 * (int)fVar104 |
                                     (uint)!bVar18 * *(int *)(local_12a0.ray + 0x10c);
                                auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_12a0.hit + 0x50));
                                *(undefined1 (*) [16])(local_12a0.ray + 0x110) = auVar50;
                                auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_12a0.hit + 0x60));
                                *(undefined1 (*) [16])(local_12a0.ray + 0x120) = auVar50;
                                auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_12a0.hit + 0x70));
                                *(undefined1 (*) [16])(local_12a0.ray + 0x130) = auVar50;
                                auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_12a0.hit + 0x80));
                                *(undefined1 (*) [16])(local_12a0.ray + 0x140) = auVar50;
                                local_1360._0_4_ = *(undefined4 *)(pRVar28 + k * 4 + 0x80);
                                local_1360._4_4_ = 0;
                                local_1360._8_4_ = 0;
                                local_1360._12_4_ = 0;
                              }
                              bVar48 = ~(byte)(1 << ((uint)uVar36 & 0x1f)) & (byte)uVar40;
                              auVar116._4_4_ = local_1360._0_4_;
                              auVar116._0_4_ = local_1360._0_4_;
                              auVar116._8_4_ = local_1360._0_4_;
                              auVar116._12_4_ = local_1360._0_4_;
                              auVar116._16_4_ = local_1360._0_4_;
                              auVar116._20_4_ = local_1360._0_4_;
                              auVar116._24_4_ = local_1360._0_4_;
                              auVar116._28_4_ = local_1360._0_4_;
                              uVar20 = vcmpps_avx512vl(auVar142._0_32_,auVar116,2);
                              if ((bVar48 & (byte)uVar20) == 0) goto LAB_006fa412;
                              bVar48 = bVar48 & (byte)uVar20;
                              uVar40 = (ulong)bVar48;
                              auVar117._8_4_ = 0x7f800000;
                              auVar117._0_8_ = 0x7f8000007f800000;
                              auVar117._12_4_ = 0x7f800000;
                              auVar117._16_4_ = 0x7f800000;
                              auVar117._20_4_ = 0x7f800000;
                              auVar117._24_4_ = 0x7f800000;
                              auVar117._28_4_ = 0x7f800000;
                              auVar97 = vblendmps_avx512vl(auVar117,auVar142._0_32_);
                              auVar103._0_4_ =
                                   (uint)(bVar48 & 1) * auVar97._0_4_ |
                                   (uint)!(bool)(bVar48 & 1) * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 1 & 1);
                              auVar103._4_4_ =
                                   (uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 2 & 1);
                              auVar103._8_4_ =
                                   (uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 3 & 1);
                              auVar103._12_4_ =
                                   (uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 4 & 1);
                              auVar103._16_4_ =
                                   (uint)bVar19 * auVar97._16_4_ | (uint)!bVar19 * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 5 & 1);
                              auVar103._20_4_ =
                                   (uint)bVar19 * auVar97._20_4_ | (uint)!bVar19 * 0x7f800000;
                              bVar19 = (bool)(bVar48 >> 6 & 1);
                              auVar103._24_4_ =
                                   (uint)bVar19 * auVar97._24_4_ | (uint)!bVar19 * 0x7f800000;
                              auVar103._28_4_ =
                                   (uint)(bVar48 >> 7) * auVar97._28_4_ |
                                   (uint)!(bool)(bVar48 >> 7) * 0x7f800000;
                              auVar97 = vshufps_avx(auVar103,auVar103,0xb1);
                              auVar97 = vminps_avx(auVar103,auVar97);
                              auVar96 = vshufpd_avx(auVar97,auVar97,5);
                              auVar97 = vminps_avx(auVar97,auVar96);
                              auVar96 = vpermpd_avx2(auVar97,0x4e);
                              auVar97 = vminps_avx(auVar97,auVar96);
                              uVar20 = vcmpps_avx512vl(auVar103,auVar97,0);
                              bVar29 = (byte)uVar20 & bVar48;
                              if (bVar29 != 0) {
                                bVar48 = bVar29;
                              }
                              uVar34 = 0;
                              for (uVar32 = (uint)bVar48; (uVar32 & 1) == 0;
                                  uVar32 = uVar32 >> 1 | 0x80000000) {
                                uVar34 = uVar34 + 1;
                              }
                              uVar36 = (ulong)uVar34;
                            } while( true );
                          }
                          uVar2 = *(undefined4 *)(local_1100 + uVar36 * 4);
                          uVar4 = *(undefined4 *)(local_10e0 + uVar36 * 4);
                          fVar129 = local_10a0[uVar36];
                          fVar49 = local_1080[uVar36];
                          uVar5 = *(undefined4 *)(local_1060 + uVar36 * 4);
                          *(float *)(local_12d0 + local_1398 * 4 + 0x80) = local_10a0[uVar36 - 8];
                          *(float *)(local_12d0 + local_1398 * 4 + 0xc0) = fVar129;
                          *(float *)(local_12d0 + local_1398 * 4 + 0xd0) = fVar49;
                          *(undefined4 *)(local_12d0 + local_1398 * 4 + 0xe0) = uVar5;
                          *(undefined4 *)(local_12d0 + local_1398 * 4 + 0xf0) = uVar2;
                          *(undefined4 *)(local_12d0 + local_1398 * 4 + 0x100) = uVar4;
                          *(uint *)(local_12d0 + local_1398 * 4 + 0x110) = uVar32;
                          *(uint *)(local_12d0 + local_1398 * 4 + 0x120) = uVar34;
                          *(uint *)(local_12d0 + local_1398 * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(local_12d0 + local_1398 * 4 + 0x140) =
                               context->user->instPrimID[0];
                        }
                      }
                    }
                  }
LAB_006fa412:
                  auVar161 = ZEXT1664(local_11e0);
                  auVar172 = ZEXT1664(local_1220);
                  auVar173 = ZEXT1664(local_11d0);
                  puVar30 = local_12c8;
                  uVar36 = local_12e8;
                  uVar40 = local_13a0;
                  uVar41 = local_12d8;
                  uVar43 = local_12e0;
                  ray = pRVar28;
                  uVar45 = local_12f0;
                  uVar46 = local_12f8;
                  fVar129 = local_11f0;
                  fVar163 = fStack_11ec;
                  fVar164 = fStack_11e8;
                  fVar165 = fStack_11e4;
                  fVar49 = local_1200;
                  fVar166 = fStack_11fc;
                  fVar167 = fStack_11f8;
                  fVar168 = fStack_11f4;
                  fVar104 = local_1210;
                  fVar169 = fStack_120c;
                  fVar170 = fStack_1208;
                  fVar171 = fStack_1204;
                }
                local_12a8 = local_12a8 - 1 & local_12a8;
              } while (local_12a8 != 0);
            }
            local_1300 = local_1300 + 1;
          } while (local_1300 != local_1308);
        }
        auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
        auVar173 = ZEXT1664(auVar50);
        auVar146 = ZEXT1664(local_1350);
        auVar142 = ZEXT1664(local_1370);
        auVar151 = ZEXT1664(_local_1270);
        fVar128 = local_1250;
        fVar106 = fStack_124c;
        fVar107 = fStack_1248;
        fVar108 = fStack_1244;
        fVar105 = local_1260;
        fVar109 = fStack_125c;
        fVar156 = fStack_1258;
        fVar157 = fStack_1254;
        break;
      }
      uVar33 = uVar44 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar110._4_4_ = uVar2;
      auVar110._0_4_ = uVar2;
      auVar110._8_4_ = uVar2;
      auVar110._12_4_ = uVar2;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar41),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar41));
      auVar50 = vsubps_avx(auVar50,auVar146._0_16_);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar43),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar43));
      auVar118._0_4_ = fVar128 * auVar50._0_4_;
      auVar118._4_4_ = fVar106 * auVar50._4_4_;
      auVar118._8_4_ = fVar107 * auVar50._8_4_;
      auVar118._12_4_ = fVar108 * auVar50._12_4_;
      auVar50 = vsubps_avx(auVar70,auVar142._0_16_);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar36),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar36));
      auVar123._0_4_ = fVar105 * auVar50._0_4_;
      auVar123._4_4_ = fVar109 * auVar50._4_4_;
      auVar123._8_4_ = fVar156 * auVar50._8_4_;
      auVar123._12_4_ = fVar157 * auVar50._12_4_;
      auVar50 = vsubps_avx(auVar70,auVar161._0_16_);
      auVar130._0_4_ = auVar151._0_4_ * auVar50._0_4_;
      auVar130._4_4_ = auVar151._4_4_ * auVar50._4_4_;
      auVar130._8_4_ = auVar151._8_4_ * auVar50._8_4_;
      auVar130._12_4_ = auVar151._12_4_ * auVar50._12_4_;
      auVar50 = vmaxps_avx(auVar123,auVar130);
      auVar70 = vmaxps_avx(auVar172._0_16_,auVar118);
      auVar50 = vmaxps_avx(auVar70,auVar50);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar45),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar45));
      auVar70 = vsubps_avx(auVar70,auVar146._0_16_);
      auVar124._0_4_ = fVar129 * auVar70._0_4_;
      auVar124._4_4_ = fVar163 * auVar70._4_4_;
      auVar124._8_4_ = fVar164 * auVar70._8_4_;
      auVar124._12_4_ = fVar165 * auVar70._12_4_;
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar46),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar46));
      auVar70 = vsubps_avx(auVar70,auVar142._0_16_);
      auVar131._0_4_ = fVar49 * auVar70._0_4_;
      auVar131._4_4_ = fVar166 * auVar70._4_4_;
      auVar131._8_4_ = fVar167 * auVar70._8_4_;
      auVar131._12_4_ = fVar168 * auVar70._12_4_;
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar40),auVar110,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar40));
      auVar70 = vsubps_avx(auVar70,auVar161._0_16_);
      auVar136._0_4_ = fVar104 * auVar70._0_4_;
      auVar136._4_4_ = fVar169 * auVar70._4_4_;
      auVar136._8_4_ = fVar170 * auVar70._8_4_;
      auVar136._12_4_ = fVar171 * auVar70._12_4_;
      auVar70 = vminps_avx(auVar131,auVar136);
      auVar51 = vminps_avx512vl(local_11d0,auVar124);
      auVar70 = vminps_avx(auVar51,auVar70);
      uVar20 = vcmpps_avx512vl(auVar50,auVar70,2);
      uVar34 = (uint)uVar20;
      if (((uint)uVar44 & 7) == 6) {
        uVar22 = vcmpps_avx512vl(auVar110,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
        uVar21 = vcmpps_avx512vl(auVar110,*(undefined1 (*) [16])(uVar33 + 0xe0),0xd);
        uVar34 = (uint)(byte)((byte)uVar22 & (byte)uVar21 & (byte)uVar20);
      }
      local_1180._0_16_ = auVar50;
      if ((byte)uVar34 != 0) goto code_r0x006f95e4;
      if (puVar30 == &local_fa0) {
        return;
      }
    }
    if (puVar30 == &local_fa0) {
      return;
    }
  } while( true );
code_r0x006f95e4:
  lVar24 = 0;
  for (uVar44 = (ulong)(byte)uVar34; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  uVar44 = *(ulong *)(uVar33 + lVar24 * 8);
  uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
  uVar35 = (ulong)uVar34;
  if (uVar34 != 0) {
    uVar32 = *(uint *)(local_1180 + lVar24 * 4);
    lVar24 = 0;
    for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      lVar24 = lVar24 + 1;
    }
    uVar34 = uVar34 - 1 & uVar34;
    uVar39 = (ulong)uVar34;
    uVar35 = *(ulong *)(uVar33 + lVar24 * 8);
    uVar31 = *(uint *)(local_1180 + lVar24 * 4);
    uVar40 = local_13a0;
    if (uVar34 == 0) {
      if (uVar32 < uVar31) {
        *puVar30 = uVar35;
        *(uint *)(puVar30 + 1) = uVar31;
        puVar30 = puVar30 + 2;
      }
      else {
        *puVar30 = uVar44;
        *(uint *)(puVar30 + 1) = uVar32;
        puVar30 = puVar30 + 2;
        uVar44 = uVar35;
      }
    }
    else {
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar44;
      auVar50 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar32));
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar35;
      auVar70 = vpunpcklqdq_avx(auVar119,ZEXT416(uVar31));
      lVar24 = 0;
      for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar34 = uVar34 - 1 & uVar34;
      uVar44 = (ulong)uVar34;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = *(ulong *)(uVar33 + lVar24 * 8);
      auVar127 = vpunpcklqdq_avx(auVar120,ZEXT416(*(uint *)(local_1180 + lVar24 * 4)));
      auVar51 = vpshufd_avx(auVar50,0xaa);
      auVar52 = vpshufd_avx(auVar70,0xaa);
      auVar126 = vpshufd_avx(auVar127,0xaa);
      if (uVar34 == 0) {
        uVar44 = vpcmpgtd_avx512vl(auVar52,auVar51);
        uVar44 = uVar44 & 0xf;
        auVar52 = vpblendmd_avx512vl(auVar70,auVar50);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar53._0_4_ = (uint)bVar19 * auVar52._0_4_ | (uint)!bVar19 * auVar51._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar19 * auVar52._4_4_ | (uint)!bVar19 * auVar51._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar19 * auVar52._8_4_ | (uint)!bVar19 * auVar51._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar53._12_4_ = (uint)bVar19 * auVar52._12_4_ | (uint)!bVar19 * auVar51._12_4_;
        auVar70 = vmovdqa32_avx512vl(auVar70);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar54._0_4_ = (uint)bVar19 * auVar70._0_4_ | (uint)!bVar19 * auVar50._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar19 * auVar70._4_4_ | (uint)!bVar19 * auVar50._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar19 * auVar70._8_4_ | (uint)!bVar19 * auVar50._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar54._12_4_ = (uint)bVar19 * auVar70._12_4_ | (uint)!bVar19 * auVar50._12_4_;
        auVar50 = vpshufd_avx(auVar53,0xaa);
        uVar33 = vpcmpgtd_avx512vl(auVar126,auVar50);
        uVar33 = uVar33 & 0xf;
        auVar70 = vpblendmd_avx512vl(auVar127,auVar53);
        bVar19 = (bool)((byte)uVar33 & 1);
        bVar15 = (bool)((byte)(uVar33 >> 1) & 1);
        uVar44 = CONCAT44((uint)bVar15 * auVar70._4_4_ | (uint)!bVar15 * auVar50._4_4_,
                          (uint)bVar19 * auVar70._0_4_ | (uint)!bVar19 * auVar50._0_4_);
        auVar50 = vmovdqa32_avx512vl(auVar127);
        bVar19 = (bool)((byte)uVar33 & 1);
        auVar55._0_4_ = (uint)bVar19 * auVar50._0_4_ | !bVar19 * auVar53._0_4_;
        bVar19 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar19 * auVar50._4_4_ | !bVar19 * auVar53._4_4_;
        bVar19 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar19 * auVar50._8_4_ | !bVar19 * auVar53._8_4_;
        bVar19 = SUB81(uVar33 >> 3,0);
        auVar55._12_4_ = (uint)bVar19 * auVar50._12_4_ | !bVar19 * auVar53._12_4_;
        auVar50 = vpshufd_avx(auVar55,0xaa);
        auVar70 = vpshufd_avx(auVar54,0xaa);
        uVar33 = vpcmpgtd_avx512vl(auVar50,auVar70);
        uVar33 = uVar33 & 0xf;
        auVar70 = vpblendmd_avx512vl(auVar55,auVar54);
        bVar19 = (bool)((byte)uVar33 & 1);
        auVar56._0_4_ = (uint)bVar19 * auVar70._0_4_ | (uint)!bVar19 * auVar50._0_4_;
        bVar19 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar19 * auVar70._4_4_ | (uint)!bVar19 * auVar50._4_4_;
        bVar19 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar19 * auVar70._8_4_ | (uint)!bVar19 * auVar50._8_4_;
        bVar19 = SUB81(uVar33 >> 3,0);
        auVar56._12_4_ = (uint)bVar19 * auVar70._12_4_ | (uint)!bVar19 * auVar50._12_4_;
        auVar50 = vmovdqa32_avx512vl(auVar55);
        bVar19 = (bool)((byte)uVar33 & 1);
        bVar15 = (bool)((byte)(uVar33 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar33 >> 2) & 1);
        bVar16 = SUB81(uVar33 >> 3,0);
        *(uint *)puVar30 = (uint)bVar19 * auVar50._0_4_ | !bVar19 * auVar54._0_4_;
        *(uint *)((long)puVar30 + 4) = (uint)bVar15 * auVar50._4_4_ | !bVar15 * auVar54._4_4_;
        *(uint *)(puVar30 + 1) = (uint)bVar18 * auVar50._8_4_ | !bVar18 * auVar54._8_4_;
        *(uint *)((long)puVar30 + 0xc) = (uint)bVar16 * auVar50._12_4_ | !bVar16 * auVar54._12_4_;
        *(undefined1 (*) [16])(puVar30 + 2) = auVar56;
        puVar30 = puVar30 + 4;
      }
      else {
        lVar24 = 0;
        for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar24 = lVar24 + 1;
        }
        uVar34 = *(uint *)(local_1180 + lVar24 * 4);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = *(ulong *)(uVar33 + lVar24 * 8);
        auVar132 = vpunpcklqdq_avx(auVar143,ZEXT416(uVar34));
        uVar44 = vpcmpgtd_avx512vl(auVar52,auVar51);
        uVar44 = uVar44 & 0xf;
        auVar52 = vpblendmd_avx512vl(auVar70,auVar50);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar57._0_4_ = (uint)bVar19 * auVar52._0_4_ | (uint)!bVar19 * auVar51._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar19 * auVar52._4_4_ | (uint)!bVar19 * auVar51._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar19 * auVar52._8_4_ | (uint)!bVar19 * auVar51._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar57._12_4_ = (uint)bVar19 * auVar52._12_4_ | (uint)!bVar19 * auVar51._12_4_;
        auVar70 = vmovdqa32_avx512vl(auVar70);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar58._0_4_ = (uint)bVar19 * auVar70._0_4_ | (uint)!bVar19 * auVar50._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar19 * auVar70._4_4_ | (uint)!bVar19 * auVar50._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar19 * auVar70._8_4_ | (uint)!bVar19 * auVar50._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar58._12_4_ = (uint)bVar19 * auVar70._12_4_ | (uint)!bVar19 * auVar50._12_4_;
        auVar125._4_4_ = uVar34;
        auVar125._0_4_ = uVar34;
        auVar125._8_4_ = uVar34;
        auVar125._12_4_ = uVar34;
        auVar151 = ZEXT1664(auVar151._0_16_);
        uVar44 = vpcmpgtd_avx512vl(auVar125,auVar126);
        uVar44 = uVar44 & 0xf;
        auVar50 = vpblendmd_avx512vl(auVar132,auVar127);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar59._0_4_ = (uint)bVar19 * auVar50._0_4_ | !bVar19 * uVar34;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar19 * auVar50._4_4_ | !bVar19 * uVar34;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar19 * auVar50._8_4_ | !bVar19 * uVar34;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar59._12_4_ = (uint)bVar19 * auVar50._12_4_ | !bVar19 * uVar34;
        auVar50 = vmovdqa32_avx512vl(auVar132);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar60._0_4_ = (uint)bVar19 * auVar50._0_4_ | (uint)!bVar19 * auVar127._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar19 * auVar50._4_4_ | (uint)!bVar19 * auVar127._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar19 * auVar50._8_4_ | (uint)!bVar19 * auVar127._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar60._12_4_ = (uint)bVar19 * auVar50._12_4_ | (uint)!bVar19 * auVar127._12_4_;
        auVar146 = ZEXT1664(local_1350);
        auVar50 = vpshufd_avx(auVar60,0xaa);
        auVar70 = vpshufd_avx(auVar58,0xaa);
        uVar44 = vpcmpgtd_avx512vl(auVar50,auVar70);
        uVar44 = uVar44 & 0xf;
        auVar70 = vpblendmd_avx512vl(auVar60,auVar58);
        bVar19 = (bool)((byte)uVar44 & 1);
        auVar61._0_4_ = (uint)bVar19 * auVar70._0_4_ | (uint)!bVar19 * auVar50._0_4_;
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar19 * auVar70._4_4_ | (uint)!bVar19 * auVar50._4_4_;
        bVar19 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar19 * auVar70._8_4_ | (uint)!bVar19 * auVar50._8_4_;
        bVar19 = SUB81(uVar44 >> 3,0);
        auVar61._12_4_ = (uint)bVar19 * auVar70._12_4_ | (uint)!bVar19 * auVar50._12_4_;
        auVar51 = vmovdqa32_avx512vl(auVar60);
        bVar19 = (bool)((byte)uVar44 & 1);
        bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar44 >> 2) & 1);
        bVar17 = SUB81(uVar44 >> 3,0);
        auVar50 = vpshufd_avx(auVar59,0xaa);
        auVar70 = vpshufd_avx(auVar57,0xaa);
        uVar33 = vpcmpgtd_avx512vl(auVar50,auVar70);
        uVar33 = uVar33 & 0xf;
        auVar70 = vpblendmd_avx512vl(auVar59,auVar57);
        bVar15 = (bool)((byte)uVar33 & 1);
        bVar16 = (bool)((byte)(uVar33 >> 1) & 1);
        uVar44 = CONCAT44((uint)bVar16 * auVar70._4_4_ | (uint)!bVar16 * auVar50._4_4_,
                          (uint)bVar15 * auVar70._0_4_ | (uint)!bVar15 * auVar50._0_4_);
        auVar50 = vmovdqa32_avx512vl(auVar59);
        bVar15 = (bool)((byte)uVar33 & 1);
        auVar62._0_4_ = (uint)bVar15 * auVar50._0_4_ | !bVar15 * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar15 * auVar50._4_4_ | !bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar15 * auVar50._8_4_ | !bVar15 * auVar57._8_4_;
        bVar15 = SUB81(uVar33 >> 3,0);
        auVar62._12_4_ = (uint)bVar15 * auVar50._12_4_ | !bVar15 * auVar57._12_4_;
        auVar50 = vpshufd_avx(auVar62,0xaa);
        auVar70 = vpshufd_avx(auVar61,0xaa);
        uVar33 = vpcmpgtd_avx512vl(auVar70,auVar50);
        uVar33 = uVar33 & 0xf;
        auVar70 = vpblendmd_avx512vl(auVar61,auVar62);
        bVar15 = (bool)((byte)uVar33 & 1);
        auVar63._0_4_ = (uint)bVar15 * auVar70._0_4_ | (uint)!bVar15 * auVar50._0_4_;
        bVar15 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar63._4_4_ = (uint)bVar15 * auVar70._4_4_ | (uint)!bVar15 * auVar50._4_4_;
        bVar15 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar63._8_4_ = (uint)bVar15 * auVar70._8_4_ | (uint)!bVar15 * auVar50._8_4_;
        bVar15 = SUB81(uVar33 >> 3,0);
        auVar63._12_4_ = (uint)bVar15 * auVar70._12_4_ | (uint)!bVar15 * auVar50._12_4_;
        auVar50 = vmovdqa32_avx512vl(auVar61);
        bVar15 = (bool)((byte)uVar33 & 1);
        auVar64._0_4_ = (uint)bVar15 * auVar50._0_4_ | !bVar15 * auVar62._0_4_;
        bVar15 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar15 * auVar50._4_4_ | !bVar15 * auVar62._4_4_;
        bVar15 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar15 * auVar50._8_4_ | !bVar15 * auVar62._8_4_;
        bVar15 = SUB81(uVar33 >> 3,0);
        auVar64._12_4_ = (uint)bVar15 * auVar50._12_4_ | !bVar15 * auVar62._12_4_;
        *(uint *)puVar30 = (uint)bVar19 * auVar51._0_4_ | !bVar19 * auVar58._0_4_;
        *(uint *)((long)puVar30 + 4) = (uint)bVar18 * auVar51._4_4_ | !bVar18 * auVar58._4_4_;
        *(uint *)(puVar30 + 1) = (uint)bVar14 * auVar51._8_4_ | !bVar14 * auVar58._8_4_;
        *(uint *)((long)puVar30 + 0xc) = (uint)bVar17 * auVar51._12_4_ | !bVar17 * auVar58._12_4_;
        *(undefined1 (*) [16])(puVar30 + 2) = auVar64;
        *(undefined1 (*) [16])(puVar30 + 4) = auVar63;
        puVar30 = puVar30 + 6;
      }
      auVar142 = ZEXT1664(local_1370);
    }
  }
  goto joined_r0x006f94fb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }